

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  curl_off_t *pcVar1;
  Curl_easy *pCVar2;
  CURLcode CVar3;
  short *psVar4;
  curl_write_callback p_Var5;
  size_t sVar6;
  short *psVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  curl_write_callback p_Var11;
  
  pCVar2 = conn->data;
  if (len == 0) {
    len = strlen(ptr);
  }
  if (((((type & 1U) != 0) && ((conn->handler->protocol & 0xc) != 0)) &&
      ((conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    if ((pCVar2->state).prev_block_had_trailing_cr == true) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar1 = &(pCVar2->state).crlf_conversions;
        *pcVar1 = *pcVar1 + 1;
      }
      (pCVar2->state).prev_block_had_trailing_cr = false;
    }
    psVar4 = (short *)memchr(ptr,0xd,len);
    if (psVar4 != (short *)0x0) {
      for (psVar7 = psVar4; psVar7 < ptr + (len - 1); psVar7 = (short *)((long)psVar7 + 1)) {
        if (*psVar7 == 0xa0d) {
          pcVar9 = (char *)((long)psVar7 + 1);
          psVar7 = (short *)((long)psVar7 + 1);
          *(char *)psVar4 = *pcVar9;
          pcVar1 = &(pCVar2->state).crlf_conversions;
          *pcVar1 = *pcVar1 + 1;
        }
        else if ((char)*psVar7 == '\r') {
          *(char *)psVar4 = '\n';
        }
        else {
          *(char *)psVar4 = (char)*psVar7;
        }
        psVar4 = (short *)((long)psVar4 + 1);
      }
      if (psVar7 < ptr + len) {
        if ((char)*psVar7 == '\r') {
          *(char *)psVar4 = '\n';
          (pCVar2->state).prev_block_had_trailing_cr = true;
        }
        else {
          *(char *)psVar4 = (char)*psVar7;
        }
        psVar4 = (short *)((long)psVar4 + 1);
      }
      if (psVar4 < ptr + len) {
        *(char *)psVar4 = '\0';
      }
      len = (long)psVar4 - (long)ptr;
    }
  }
  if (len == 0) {
    return CURLE_OK;
  }
  pCVar2 = conn->data;
  pcVar9 = ptr;
  sVar10 = len;
  if (((pCVar2->req).keepon & 0x10) != 0) goto LAB_00122ec4;
  if ((type & 1U) == 0) {
    p_Var11 = (curl_write_callback)0x0;
  }
  else {
    p_Var11 = (pCVar2->set).fwrite_func;
  }
  if ((type & 2U) == 0) {
LAB_00122ee8:
    p_Var5 = (curl_write_callback)0x0;
  }
  else {
    p_Var5 = (pCVar2->set).fwrite_header;
    if (p_Var5 == (curl_write_callback)0x0) {
      if ((pCVar2->set).writeheader == (void *)0x0) goto LAB_00122ee8;
      p_Var5 = (pCVar2->set).fwrite_func;
    }
  }
  do {
    sVar8 = 0x4000;
    if (sVar10 < 0x4000) {
      sVar8 = sVar10;
    }
    if (p_Var11 != (curl_write_callback)0x0) {
      sVar6 = (*p_Var11)(pcVar9,1,sVar8,(pCVar2->set).out);
      if (sVar6 == 0x10000001) {
        if ((conn->handler->flags & 0x10) == 0) goto LAB_00122ec4;
        pcVar9 = "Write callback asked for PAUSE when not supported!";
        goto LAB_0012301d;
      }
      if (sVar6 != sVar8) {
        Curl_failf(pCVar2,"Failed writing body (%zu != %zu)",sVar6,sVar8);
        return CURLE_WRITE_ERROR;
      }
    }
    sVar10 = sVar10 - sVar8;
    pcVar9 = pcVar9 + sVar8;
  } while (sVar10 != 0);
  if (p_Var5 == (curl_write_callback)0x0) {
    return CURLE_OK;
  }
  Curl_set_in_callback(pCVar2,true);
  sVar10 = (*p_Var5)(ptr,1,len,(pCVar2->set).writeheader);
  Curl_set_in_callback(pCVar2,false);
  if (sVar10 != 0x10000001) {
    if (sVar10 == len) {
      return CURLE_OK;
    }
    pcVar9 = "Failed writing header";
LAB_0012301d:
    Curl_failf(pCVar2,pcVar9);
    return CURLE_WRITE_ERROR;
  }
  type = 2;
  pcVar9 = ptr;
  sVar10 = len;
LAB_00122ec4:
  CVar3 = pausewrite(pCVar2,type,pcVar9,sVar10);
  return CVar3;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct Curl_easy *data = conn->data;

  if(0 == len)
    len = strlen(ptr);

  DEBUGASSERT(type <= 3);

  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
    (conn->handler->protocol & PROTO_FAMILY_FTP) &&
    conn->proto.ftpc.transfertype == 'A') {
    /* convert from the network encoding */
    CURLcode result = Curl_convert_from_network(data, ptr, len);
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

#ifdef CURL_DO_LINEEND_CONV
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }

  return chop_write(conn, type, ptr, len);
}